

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O0

int opn2_getBankId(OPN2_MIDIPlayer *device,OPN2_Bank *bank,OPN2_BankId *id)

{
  ulong uVar1;
  value_type *pvVar2;
  key_type idnumber;
  iterator it;
  OPN2_BankId *id_local;
  OPN2_Bank *bank_local;
  OPN2_MIDIPlayer *device_local;
  
  if ((device == (OPN2_MIDIPlayer *)0x0) || (bank == (OPN2_Bank *)0x0)) {
    device_local._4_4_ = -1;
  }
  else {
    it.index = (size_t)id;
    BasicBankMap<OPN2::Bank>::iterator::from_ptrs((iterator *)&idnumber,bank->pointer);
    pvVar2 = BasicBankMap<OPN2::Bank>::iterator::operator->((iterator *)&idnumber);
    uVar1 = pvVar2->first;
    *(byte *)(it.index + 1) = (byte)(uVar1 >> 8) & 0x7f;
    *(byte *)(it.index + 2) = (byte)uVar1 & 0x7f;
    *(bool *)it.index = (uVar1 & 0x8000) != 0;
    device_local._4_4_ = 0;
  }
  return device_local._4_4_;
}

Assistant:

OPNMIDI_EXPORT int opn2_getBankId(OPN2_MIDIPlayer *device, const OPN2_Bank *bank, OPN2_BankId *id)
{
    if(!device || !bank)
        return -1;

    Synth::BankMap::iterator it = Synth::BankMap::iterator::from_ptrs(bank->pointer);
    Synth::BankMap::key_type idnumber = it->first;
    id->msb = (idnumber >> 8) & 127;
    id->lsb = idnumber & 127;
    id->percussive = (idnumber & Synth::PercussionTag) ? 1 : 0;
    return 0;
}